

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::XmlUnitTestResultPrinter::OnTestIterationEnd
          (XmlUnitTestResultPrinter *this,UnitTest *unit_test,int param_3)

{
  FILE *__stream;
  undefined8 uVar1;
  stringstream stream;
  FILE *xmlout;
  UnitTest *in_stack_00000208;
  ostream *in_stack_00000210;
  string local_1d8 [48];
  stringstream local_1a8 [32];
  stringstream *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffeb0;
  
  __stream = (FILE *)OpenFileForWriting(in_stack_fffffffffffffeb0);
  std::__cxx11::stringstream::stringstream(local_1a8);
  PrintXmlUnitTest(in_stack_00000210,in_stack_00000208);
  StringStreamToString(in_stack_fffffffffffffe78);
  uVar1 = std::__cxx11::string::c_str();
  fprintf(__stream,"%s",uVar1);
  std::__cxx11::string::~string(local_1d8);
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                  int /*iteration*/) {
  FILE* xmlout = OpenFileForWriting(output_file_);
  std::stringstream stream;
  PrintXmlUnitTest(&stream, unit_test);
  fprintf(xmlout, "%s", StringStreamToString(&stream).c_str());
  fclose(xmlout);
}